

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldOptions_EditionDefault::Clear(FieldOptions_EditionDefault *this)

{
  if ((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x1) !=
      (undefined1  [24])0x0) {
    internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.value_);
  }
  (this->field_0)._impl_.edition_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FieldOptions_EditionDefault::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldOptions.EditionDefault)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.value_.ClearNonDefaultToEmpty();
  }
  _impl_.edition_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}